

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall
Js::JavascriptLibrary::CacheCustomExternalWrapperType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t interceptors,uintptr_t prototype,DynamicType *dynamicTypeToCache)

{
  WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar1;
  Recycler *recycler;
  RecyclerWeakReferenceBase *local_48;
  CustomExternalWrapperCallbacks local_40;
  
  pWVar1 = (this->customExternalWrapperTypesCache).ptr;
  recycler = this->recycler;
  local_40.traceCallback = traceCallback;
  local_40.finalizeCallback = finalizeCallback;
  local_40.interceptors = interceptors;
  local_40.prototype = prototype;
  local_48 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)dynamicTypeToCache,recycler);
  if (local_48->typeInfo == (Type)0x0) {
    local_48->typeInfo = (Type)&DynamicType::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,local_48);
  }
  JsUtil::
  BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
              *)&pWVar1->
                 super_BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
             ,&local_40,(RecyclerWeakReference<Js::DynamicType> **)&local_48);
  return;
}

Assistant:

void JavascriptLibrary::CacheCustomExternalWrapperType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t interceptors, uintptr_t prototype, DynamicType* dynamicTypeToCache)
    {
        customExternalWrapperTypesCache->Item(CustomExternalWrapperCallbacks(traceCallback, finalizeCallback, interceptors, prototype), recycler->CreateWeakReferenceHandle<DynamicType>(dynamicTypeToCache));
    }